

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QList<QByteArray> * QTimeZonePrivate::windowsIdToIanaIds(QByteArray *windowsId,Territory territory)

{
  bool bVar1;
  quint16 qVar2;
  ZoneData *pZVar3;
  QLatin1String *pQVar4;
  short in_DX;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<const_QLatin1String_&,_char16_t> *__range4;
  ZoneData *data;
  qint16 land;
  quint16 windowsIdKey;
  QList<QByteArray> *list;
  QLatin1String l1;
  sentinel __end4;
  iterator __begin4;
  rvalue_ref in_stack_fffffffffffffec8;
  iterator *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  quint16 windowsIdKey_00;
  QByteArray *in_stack_fffffffffffffef0;
  ZoneData *size;
  undefined5 in_stack_fffffffffffffef8;
  undefined1 uVar5;
  quint16 qVar6;
  QList<QByteArray> *this;
  ZoneData *local_e0;
  QLatin1String local_98;
  undefined1 local_79;
  undefined1 local_78 [80];
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  windowsIdKey_00 = (quint16)((ulong)in_stack_fffffffffffffed8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QByteArray>::QList((QList<QByteArray> *)0x73b7e8);
  if (in_DX == 0x102) {
    windowsIdToDefaultIanaId(in_stack_fffffffffffffef0);
    QList<QByteArray>::operator<<
              ((QList<QByteArray> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QByteArray::~QByteArray((QByteArray *)0x73b829);
  }
  else {
    qVar2 = toWindowsIdKey(in_stack_fffffffffffffef0);
    qVar6 = qVar2;
    local_e0 = zoneStartForWindowsId(windowsIdKey_00);
    while( true ) {
      size = local_e0;
      pZVar3 = std::end<QtTimeZoneCldr::ZoneData_const,361ul>
                         ((ZoneData (*) [361])&QtTimeZoneCldr::zoneDataTable);
      uVar5 = false;
      if (size != pZVar3) {
        uVar5 = local_e0->windowsIdKey == qVar2;
      }
      if ((bool)uVar5 == false) goto LAB_0073ba5f;
      if ((uint)local_e0->territory == (int)in_DX) break;
      local_e0 = local_e0 + 1;
    }
    QtTimeZoneCldr::ZoneData::ids((ZoneData *)in_stack_fffffffffffffed0);
    memset(local_78,0xaa,0x38);
    QStringTokenizerBase<QLatin1String,_QChar>::begin
              ((QStringTokenizerBase<QLatin1String,_QChar> *)in_stack_fffffffffffffed0);
    local_79 = 0xaa;
    QStringTokenizerBase<QLatin1String,_QChar>::end(&local_28);
    while (bVar1 = ::operator!=(local_78), bVar1) {
      local_98.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.m_data = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*((iterator *)0x73b9a1)
      ;
      local_98.m_size = pQVar4->m_size;
      local_98.m_data = pQVar4->m_data;
      pQVar4 = &local_98;
      QLatin1String::data(pQVar4);
      QLatin1String::size(pQVar4);
      QByteArray::QByteArray
                ((QByteArray *)this,
                 (char *)CONCAT26(qVar6,CONCAT15(uVar5,in_stack_fffffffffffffef8)),(qsizetype)size);
      QList<QByteArray>::operator<<
                ((QList<QByteArray> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QByteArray::~QByteArray((QByteArray *)0x73ba11);
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++(in_stack_fffffffffffffed0);
    }
  }
LAB_0073ba5f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZonePrivate::windowsIdToIanaIds(const QByteArray &windowsId,
                                                       QLocale::Territory territory)
{
    QList<QByteArray> list;
    if (territory == QLocale::World) {
        // World data are in windowsDataTable, not zoneDataTable.
        list << windowsIdToDefaultIanaId(windowsId);
    } else {
        const quint16 windowsIdKey = toWindowsIdKey(windowsId);
        const qint16 land = static_cast<quint16>(territory);
        for (auto data = zoneStartForWindowsId(windowsIdKey);
             data != std::end(zoneDataTable) && data->windowsIdKey == windowsIdKey;
             ++data) {
            // Return the region matches in preference order
            if (data->territory == land) {
                for (auto l1 : data->ids())
                    list << QByteArray(l1.data(), l1.size());
                break;
            }
        }
    }

    return list;
}